

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldRef.c
# Opt level: O0

Abc_Cex_t * Saig_ManCexRemap(Aig_Man_t *p,Aig_Man_t *pAbs,Abc_Cex_t *pCexAbs)

{
  int iVar1;
  int nRealPis;
  int local_38;
  int local_34;
  int f;
  int i;
  Aig_Obj_t *pObj;
  Abc_Cex_t *pCex;
  Abc_Cex_t *pCexAbs_local;
  Aig_Man_t *pAbs_local;
  Aig_Man_t *p_local;
  
  iVar1 = Saig_ManVerifyCex(pAbs,pCexAbs);
  if (iVar1 == 0) {
    printf("Saig_ManCexRemap(): The initial counter-example is invalid.\n");
  }
  iVar1 = Aig_ManRegNum(p);
  nRealPis = Saig_ManPiNum(p);
  pObj = (Aig_Obj_t *)Abc_CexAlloc(iVar1,nRealPis,pCexAbs->iFrame + 1);
  *(int *)((long)&pObj->field_0 + 4) = pCexAbs->iFrame;
  (pObj->field_0).CioId = pCexAbs->iPo;
  local_38 = 0;
  do {
    if (pCexAbs->iFrame < local_38) {
      iVar1 = Saig_ManVerifyCex(p,(Abc_Cex_t *)pObj);
      if (iVar1 == 0) {
        printf("Saig_ManCexRemap(): Counter-example is invalid.\n");
        Abc_CexFree((Abc_Cex_t *)pObj);
        pObj = (Aig_Obj_t *)0x0;
      }
      else {
        Abc_Print(1,"Counter-example verification is successful.\n");
        Abc_Print(1,"Output %d of miter \"%s\" was asserted in frame %d. \n",
                  (ulong)(uint)(pObj->field_0).CioId,p->pName,
                  (ulong)(uint)*(int *)((long)&pObj->field_0 + 4));
      }
      return (Abc_Cex_t *)pObj;
    }
    for (local_34 = 0; iVar1 = Saig_ManPiNum(pAbs), local_34 < iVar1; local_34 = local_34 + 1) {
      Vec_PtrEntry(pAbs->vCis,local_34);
      iVar1 = Saig_ManPiNum(p);
      if (local_34 == iVar1) break;
      iVar1 = Abc_InfoHasBit((uint *)(pCexAbs + 1),
                             pCexAbs->nRegs + pCexAbs->nPis * local_38 + local_34);
      if (iVar1 != 0) {
        Abc_InfoSetBit((uint *)((long)&pObj->pFanin1 + 4),
                       *(int *)&pObj->pFanin0 + *(int *)((long)&pObj->pFanin0 + 4) * local_38 +
                       local_34);
      }
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

Abc_Cex_t * Saig_ManCexRemap( Aig_Man_t * p, Aig_Man_t * pAbs, Abc_Cex_t * pCexAbs )
{
    Abc_Cex_t * pCex;
    Aig_Obj_t * pObj;
    int i, f;
    if ( !Saig_ManVerifyCex( pAbs, pCexAbs ) )
        printf( "Saig_ManCexRemap(): The initial counter-example is invalid.\n" );
//    else
//        printf( "Saig_ManCexRemap(): The initial counter-example is correct.\n" );
    // start the counter-example
    pCex = Abc_CexAlloc( Aig_ManRegNum(p), Saig_ManPiNum(p), pCexAbs->iFrame+1 );
    pCex->iFrame = pCexAbs->iFrame;
    pCex->iPo    = pCexAbs->iPo;
    // copy the bit data
    for ( f = 0; f <= pCexAbs->iFrame; f++ )
    {
        Saig_ManForEachPi( pAbs, pObj, i )
        {
            if ( i == Saig_ManPiNum(p) )
                break;
            if ( Abc_InfoHasBit( pCexAbs->pData, pCexAbs->nRegs + pCexAbs->nPis * f + i ) )
                Abc_InfoSetBit( pCex->pData, pCex->nRegs + pCex->nPis * f + i );
        }
    }
    // verify the counter example
    if ( !Saig_ManVerifyCex( p, pCex ) )
    {
        printf( "Saig_ManCexRemap(): Counter-example is invalid.\n" );
        Abc_CexFree( pCex );
        pCex = NULL;
    }
    else
    {
        Abc_Print( 1, "Counter-example verification is successful.\n" );
        Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d. \n", pCex->iPo, p->pName, pCex->iFrame );
    }
    return pCex;
}